

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_setup_one_bcm(APITests *this)

{
  int iVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  GPIO::setmode(BCM);
  iVar1 = GPIO::getmode();
  std::__cxx11::string::string((string *)&local_30,"",&local_51);
  assert::is_true(iVar1 == 1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GPIO::setup(this->bcm_pin,IN,-1);
  GPIO::cleanup();
  iVar1 = GPIO::getmode();
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  assert::is_true(iVar1 == 4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void test_setup_one_bcm()
    {
        GPIO::setmode(GPIO::BCM);
        assert::is_true(GPIO::getmode() == GPIO::BCM);
        GPIO::setup(bcm_pin, GPIO::IN);
        GPIO::cleanup();
        assert::is_true(GPIO::getmode() == GPIO::NumberingModes::None);
    }